

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::Description_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneLibC *this)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "UTC";
  if (this->local_ != false) {
    __s = "localtime";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneLibC::Description() const {
  return local_ ? "localtime" : "UTC";
}